

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::readEditFaceData(PtexReader *this)

{
  pointer pFVar1;
  ushort uVar2;
  int size;
  int alphachan;
  pointer pFVar3;
  uint8_t *puVar4;
  iterator __position;
  bool bVar5;
  pointer pFVar6;
  long lVar7;
  EditFaceDataHeader efdh;
  uint local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  int32_t iStack_40;
  uint32_t local_3c;
  FaceEdit local_38;
  
  local_50 = 0;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  iStack_40 = -1;
  local_3c = 0;
  bVar5 = readBlock(this,&local_54,0x1c,true);
  if (bVar5) {
    lVar7 = (long)(int)local_54;
    if ((-1 < lVar7) && (local_54 < (this->_header).nfaces)) {
      pFVar3 = (this->_faceinfo).
               super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar1 = pFVar3 + lVar7;
      (pFVar1->res).ulog2 = (char)(short)local_50;
      (pFVar1->res).vlog2 = (char)((ushort)(short)local_50 >> 8);
      pFVar1->adjedges = (char)((uint)local_50 >> 0x10);
      pFVar1->flags = (char)((uint)local_50 >> 0x18);
      pFVar1->adjfaces[0] = uStack_4c;
      *(ulong *)(pFVar1->adjfaces + 1) = CONCAT44(uStack_44,uStack_48);
      pFVar3[lVar7].adjfaces[3] = iStack_40;
      pFVar3[lVar7].flags = pFVar3[lVar7].flags | 2;
      size = this->_pixelsize;
      puVar4 = this->_constdata;
      bVar5 = readBlock(this,puVar4 + (int)(size * local_54),size,true);
      if (bVar5) {
        if (this->_premultiply == true) {
          alphachan = (this->_header).alphachan;
          uVar2 = (this->_header).nchannels;
          if (alphachan < (int)(uint)uVar2 && -1 < alphachan) {
            PtexUtils::multalpha
                      (puVar4 + (int)(size * local_54),1,(this->_header).datatype,(uint)uVar2,
                       alphachan);
          }
        }
        if ((pFVar3[lVar7].flags & 1) == 0) {
          local_38.pos = 0;
          local_38.faceid = 0;
          local_38.fdh.data = 0;
          __position._M_current =
               (this->_faceedits).
               super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->_faceedits).
              super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
            ::_M_realloc_insert<Ptex::v2_2::PtexReader::FaceEdit>
                      (&this->_faceedits,__position,&local_38);
            pFVar6 = (this->_faceedits).
                     super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (__position._M_current)->pos = 0;
            (__position._M_current)->faceid = 0;
            (__position._M_current)->fdh = 0;
            pFVar6 = (this->_faceedits).
                     super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->_faceedits).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
            ._M_impl.super__Vector_impl_data._M_finish = pFVar6;
          }
          pFVar6[-1].pos = this->_pos;
          pFVar6[-1].faceid = local_54;
          pFVar6[-1].fdh.data = local_3c;
        }
      }
    }
  }
  return;
}

Assistant:

void PtexReader::readEditFaceData()
{
    // read header
    EditFaceDataHeader efdh;
    if (!readBlock(&efdh, EditFaceDataHeaderSize)) return;

    // update face info
    int faceid = efdh.faceid;
    if (faceid < 0 || size_t(faceid) >= _header.nfaces) return;
    FaceInfo& f = _faceinfo[faceid];
    f = efdh.faceinfo;
    f.flags |= FaceInfo::flag_hasedits;

    // read const value now
    uint8_t* constdata = _constdata + _pixelsize * faceid;
    if (!readBlock(constdata, _pixelsize)) return;
    if (_premultiply && _header.hasAlpha())
        PtexUtils::multalpha(constdata, 1, datatype(),
                             _header.nchannels, _header.alphachan);

    // update header info for remaining data
    if (!f.isConstant()) {
        _faceedits.push_back(FaceEdit());
        FaceEdit& e = _faceedits.back();
        e.pos = tell();
        e.faceid = faceid;
        e.fdh = efdh.fdh;
    }
}